

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

char __thiscall capnp::anon_unknown_79::Input::nextChar(Input *this)

{
  char cVar1;
  long in_RSI;
  Fault f;
  Fault local_10;
  
  if ((in_RSI != 0) && (cVar1 = *(char *)&(this->wrapped).ptr, cVar1 != '\0')) {
    return cVar1;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x21a,FAILED,"!exhausted()","\"JSON message ends prematurely.\"",
             (char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

bool exhausted() {
    return wrapped.size() == 0 || wrapped.front() == '\0';
  }